

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blockers_simplices_iterators.h
# Opt level: O1

Trie * __thiscall
Gudhi::skeleton_blocker::
Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
::build_trie(Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
             *this,Link_vertex_handle link_vh,Trie *parent)

{
  Link_vertex_handle vh_in_other;
  pointer psVar1;
  Vertex_handle VVar2;
  int iVar3;
  Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  *this_00;
  Trie *child;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  pair<std::_Rb_tree_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_bool>
  pVar6;
  Simplex simplex_node_plus_nv;
  Vertex_handle local_64;
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
  local_60 [48];
  
  this_00 = (Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
             *)operator_new(0x28);
  VVar2 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
          convert_handle_from_another_complex
                    (this->complex,
                     (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                      *)(this->link_v).
                        super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,link_vh.vertex);
  (this_00->v).vertex = VVar2.vertex;
  (this_00->children).
  super__Vector_base<std::shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>,_std::allocator<std::shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->children).
  super__Vector_base<std::shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>,_std::allocator<std::shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->children).
  super__Vector_base<std::shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>,_std::allocator<std::shared_ptr<Gudhi::skeleton_blocker::Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->parent_ = parent;
  psVar1 = (((this->link_v).
             super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->
           super_Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
           ).
           super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
           .super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>.
           skeleton.super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var5 = &psVar1[link_vh.vertex].super_StoredVertex.m_out_edges._M_t._M_impl.super__Rb_tree_header
            ._M_header;
  p_Var4 = psVar1[link_vh.vertex].super_StoredVertex.m_out_edges._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_left;
  if (p_Var4 != p_Var5) {
    do {
      vh_in_other.vertex = p_Var4[1]._M_color;
      if (link_vh.vertex < vh_in_other.vertex) {
        Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
        ::simplex((Simplex *)local_60,this_00);
        local_64.vertex =
             (boost_vertex_handle)
             Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
             convert_handle_from_another_complex
                       (this->complex,
                        (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                         *)(this->link_v).
                           super___shared_ptr<Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,vh_in_other.vertex);
        pVar6 = std::
                _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
                ::
                _M_insert_unique<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle_const&>
                          (local_60,&local_64);
        iVar3 = (*this->complex->_vptr_Skeleton_blocker_complex[9])
                          (this->complex,local_60,pVar6._8_8_);
        if ((char)iVar3 != '\0') {
          child = build_trie(this,vh_in_other,this_00);
          Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
          ::add_child(this_00,child);
        }
        std::
        _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
        ::~_Rb_tree((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                     *)local_60);
      }
      if (p_Var4 != p_Var5) {
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      }
    } while (p_Var4 != p_Var5);
  }
  return this_00;
}

Assistant:

Trie* build_trie(Link_vertex_handle link_vh, Trie* parent) {
    Trie* res = new Trie(parent_vertex(link_vh), parent);
    for (Link_vertex_handle nv : link_v->vertex_range(link_vh)) {
      if (link_vh < nv) {
        Simplex simplex_node_plus_nv(res->simplex());
        simplex_node_plus_nv.add_vertex(parent_vertex(nv));
        if (complex->contains(simplex_node_plus_nv)) {
          res->add_child(build_trie(nv, res));
        }
      }
    }
    return res;
  }